

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O0

Value __thiscall xmrig::Hashrate::toJSON(Hashrate *this,size_t threadId,Document *doc)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RCX;
  undefined8 extraout_RDX;
  undefined8 in_RDI;
  double d;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Value VVar1;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined4 in_stack_ffffffffffffff58;
  Type in_stack_ffffffffffffff5c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_70;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_60;
  size_t in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GetAllocator(in_RCX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  calc((Hashrate *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  normalize(in_stack_ffffffffffffff68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack(in_stack_ffffffffffffff60,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
           (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x1f2d42);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffffc0);
  d = calc((Hashrate *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
          );
  normalize(d);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack(in_stack_ffffffffffffff60,
           (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
           (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x1f2d96);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_60);
  this_00 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)calc((Hashrate *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffb8);
  normalize(d);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  PushBack(this_00,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
           (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x1f2dea);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_70);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)in_RDI;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::Hashrate::toJSON(size_t threadId, rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kArrayType);
    out.PushBack(normalize(calc(threadId, ShortInterval)),  allocator);
    out.PushBack(normalize(calc(threadId, MediumInterval)), allocator);
    out.PushBack(normalize(calc(threadId, LargeInterval)),  allocator);

    return out;
}